

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fixedEnvelopes.cpp
# Opt level: O3

double __thiscall
IsoSpec::FixedEnvelope::WassersteinDistance(FixedEnvelope *this,FixedEnvelope *other)

{
  double *pdVar1;
  ulong uVar2;
  ulong uVar3;
  logic_error *this_00;
  ulong uVar4;
  size_t sVar5;
  ulong uVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  
  dVar7 = this->total_prob;
  if (NAN(dVar7)) {
    this->total_prob = 0.0;
    if (this->_confs_no == 0) {
      dVar7 = 0.0;
    }
    else {
      dVar7 = 0.0;
      sVar5 = 0;
      do {
        dVar7 = dVar7 + this->_probs[sVar5];
        this->total_prob = dVar7;
        sVar5 = sVar5 + 1;
      } while (this->_confs_no != sVar5);
    }
  }
  dVar10 = other->total_prob;
  if (NAN(dVar10)) {
    other->total_prob = 0.0;
    if (other->_confs_no != 0) {
      dVar10 = 0.0;
      sVar5 = 0;
      do {
        dVar10 = dVar10 + other->_probs[sVar5];
        other->total_prob = dVar10;
        sVar5 = sVar5 + 1;
      } while (other->_confs_no != sVar5);
      goto LAB_00117fea;
    }
    dVar10 = 0.0;
    if (0.0 < dVar7 * 0.999) goto LAB_00118291;
  }
  else {
LAB_00117fea:
    if (dVar10 < dVar7 * 0.999) goto LAB_00118291;
    if (NAN(dVar10)) {
      other->total_prob = 0.0;
      if (other->_confs_no == 0) {
        dVar10 = 0.0;
      }
      else {
        dVar10 = 0.0;
        sVar5 = 0;
        do {
          dVar10 = dVar10 + other->_probs[sVar5];
          other->total_prob = dVar10;
          sVar5 = sVar5 + 1;
        } while (other->_confs_no != sVar5);
      }
    }
  }
  dVar7 = this->total_prob;
  if (NAN(dVar7)) {
    this->total_prob = 0.0;
    if (this->_confs_no == 0) {
      dVar7 = 0.0;
    }
    else {
      dVar7 = 0.0;
      sVar5 = 0;
      do {
        dVar7 = dVar7 + this->_probs[sVar5];
        this->total_prob = dVar7;
        sVar5 = sVar5 + 1;
      } while (this->_confs_no != sVar5);
    }
  }
  if (dVar10 <= dVar7 * 1.001) {
    dVar7 = 0.0;
    if ((this->_confs_no != 0) && (other->_confs_no != 0)) {
      if (this->sorted_by_mass == false) {
        sort_by(this,this->_masses);
        this->sorted_by_mass = true;
        this->sorted_by_prob = false;
      }
      if (other->sorted_by_mass == false) {
        sort_by(other,other->_masses);
        other->sorted_by_mass = true;
        other->sorted_by_prob = false;
      }
      uVar2 = this->_confs_no;
      uVar3 = other->_confs_no;
      if (uVar3 == 0 || uVar2 == 0) {
        dVar7 = 0.0;
        uVar6 = 0;
        uVar4 = 0;
        dVar8 = 0.0;
        dVar10 = 0.0;
      }
      else {
        uVar4 = 0;
        dVar8 = 0.0;
        uVar6 = 0;
        dVar7 = 0.0;
        dVar9 = 0.0;
        do {
          pdVar1 = this->_masses + uVar6;
          dVar10 = other->_masses[uVar4];
          dVar11 = ABS(dVar8);
          if (dVar10 <= *pdVar1) {
            dVar8 = dVar8 - other->_probs[uVar4];
            uVar4 = uVar4 + 1;
          }
          else {
            dVar8 = dVar8 + this->_probs[uVar6];
            uVar6 = uVar6 + 1;
            dVar10 = *pdVar1;
          }
          dVar7 = dVar7 + (dVar10 - dVar9) * dVar11;
        } while ((uVar6 < uVar2) && (dVar9 = dVar10, uVar4 < uVar3));
      }
      dVar8 = ABS(dVar8);
      if (uVar6 < uVar2) {
        dVar9 = dVar10;
        do {
          dVar10 = this->_masses[uVar6];
          dVar9 = (dVar10 - dVar9) * dVar8;
          dVar8 = dVar8 - this->_probs[uVar6];
          dVar7 = dVar7 + dVar9;
          uVar6 = uVar6 + 1;
          dVar9 = dVar10;
        } while (uVar2 != uVar6);
      }
      if (uVar4 < uVar3) {
        do {
          pdVar1 = other->_masses + uVar4;
          dVar10 = (*pdVar1 - dVar10) * dVar8;
          dVar8 = dVar8 - other->_probs[uVar4];
          dVar7 = dVar7 + dVar10;
          uVar4 = uVar4 + 1;
          dVar10 = *pdVar1;
        } while (uVar3 != uVar4);
      }
    }
    return dVar7;
  }
LAB_00118291:
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error
            (this_00,"Spectra must be normalized before computing Wasserstein Distance");
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

double FixedEnvelope::WassersteinDistance(FixedEnvelope& other)
{
    double ret = 0.0;
    if((get_total_prob()*0.999 > other.get_total_prob()) || (other.get_total_prob() > get_total_prob()*1.001))
        throw std::logic_error("Spectra must be normalized before computing Wasserstein Distance");

    if(_confs_no == 0 || other._confs_no == 0)
        return 0.0;

    sort_by_mass();
    other.sort_by_mass();

    size_t idx_this = 0;
    size_t idx_other = 0;

    double acc_prob = 0.0;
    double last_point = 0.0;


    while(idx_this < _confs_no && idx_other < other._confs_no)
    {
        if(_masses[idx_this] < other._masses[idx_other])
        {
            ret += (_masses[idx_this] - last_point) * std::abs(acc_prob);
            acc_prob += _probs[idx_this];
            last_point = _masses[idx_this];
            idx_this++;
        }
        else
        {
            ret += (other._masses[idx_other] - last_point) * std::abs(acc_prob);
            acc_prob -= other._probs[idx_other];
            last_point = other._masses[idx_other];
            idx_other++;
        }
    }

    acc_prob = std::abs(acc_prob);

    while(idx_this < _confs_no)
    {
        ret += (_masses[idx_this] - last_point) * acc_prob;
        acc_prob -= _probs[idx_this];
        last_point = _masses[idx_this];
        idx_this++;
    }

    while(idx_other < other._confs_no)
    {
        ret += (other._masses[idx_other] - last_point) * acc_prob;
        acc_prob -= other._probs[idx_other];
        last_point = other._masses[idx_other];
        idx_other++;
    }

    return ret;
}